

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::FieldOptions::MergePartialFromCodedStream
          (FieldOptions *this,CodedInputStream *input)

{
  UnknownFieldSet *unknown_fields;
  bool bVar1;
  uint uVar2;
  string *value;
  Type *value_00;
  uint8 *puVar3;
  uint32 tag;
  uint32 temp;
  RepeatedPtrFieldBase *local_38;
  
  unknown_fields = &this->_unknown_fields_;
  local_38 = &(this->uninterpreted_option_).super_RepeatedPtrFieldBase;
LAB_001f7916:
  puVar3 = input->buffer_;
  if ((puVar3 < input->buffer_end_) && (tag = (uint32)(char)*puVar3, -1 < (char)*puVar3)) {
    input->last_tag_ = tag;
    input->buffer_ = puVar3 + 1;
  }
  else {
    tag = io::CodedInputStream::ReadTagFallback(input);
    input->last_tag_ = tag;
  }
  if (tag == 0) {
    return true;
  }
  uVar2 = tag & 7;
  switch(tag >> 3) {
  case 1:
    if (uVar2 != 0) break;
    bVar1 = io::CodedInputStream::ReadVarint32(input,&temp);
    if (!bVar1) {
      return false;
    }
    if ((ulong)(long)(int)temp < 3) {
      set_ctype(this,temp);
    }
    else {
      UnknownFieldSet::AddVarint(unknown_fields,1,(long)(int)temp);
    }
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (*puVar3 == '\x10')) {
      input->buffer_ = puVar3 + 1;
LAB_001f7a43:
      bVar1 = io::CodedInputStream::ReadVarint32(input,&temp);
      if (!bVar1) {
        return false;
      }
      this->packed_ = temp != 0;
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (*puVar3 == '\x18')) {
        input->buffer_ = puVar3 + 1;
LAB_001f7a85:
        bVar1 = io::CodedInputStream::ReadVarint32(input,&temp);
        if (!bVar1) {
          return false;
        }
        this->deprecated_ = temp != 0;
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 8;
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (*puVar3 == '(')) {
          input->buffer_ = puVar3 + 1;
LAB_001f7ac7:
          bVar1 = io::CodedInputStream::ReadVarint32(input,&temp);
          if (!bVar1) {
            return false;
          }
          this->lazy_ = temp != 0;
          *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
          puVar3 = input->buffer_;
          if ((puVar3 < input->buffer_end_) && (*puVar3 == 'J')) {
            input->buffer_ = puVar3 + 1;
LAB_001f7b09:
            value = mutable_experimental_map_key_abi_cxx11_(this);
            bVar1 = internal::WireFormatLite::ReadString(input,value);
            if (!bVar1) {
              return false;
            }
            internal::WireFormat::VerifyUTF8StringFallback
                      ((this->experimental_map_key_->_M_dataplus)._M_p,
                       (int)this->experimental_map_key_->_M_string_length,PARSE);
            puVar3 = input->buffer_;
            if ((puVar3 < input->buffer_end_) && (*puVar3 == 'P')) {
              input->buffer_ = puVar3 + 1;
LAB_001f7b53:
              bVar1 = io::CodedInputStream::ReadVarint32(input,&temp);
              if (!bVar1) {
                return false;
              }
              this->weak_ = temp != 0;
              *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x20;
              puVar3 = input->buffer_;
              if (((1 < *(int *)&input->buffer_end_ - (int)puVar3) && (*puVar3 == 0xba)) &&
                 (puVar3[1] == '>')) {
                do {
                  input->buffer_ = puVar3 + 2;
LAB_001f7b9e:
                  value_00 = internal::RepeatedPtrFieldBase::
                             Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                                       (local_38);
                  bVar1 = internal::WireFormatLite::
                          ReadMessageNoVirtual<google::protobuf::UninterpretedOption>
                                    (input,value_00);
                  if (!bVar1) {
                    return false;
                  }
                  puVar3 = input->buffer_;
                } while (((1 < *(int *)&input->buffer_end_ - (int)puVar3) && (*puVar3 == 0xba)) &&
                        (puVar3[1] == '>'));
                bVar1 = io::CodedInputStream::ExpectAtEnd(input);
                if (bVar1) {
                  return true;
                }
              }
            }
          }
        }
      }
    }
    goto LAB_001f7916;
  case 2:
    if (uVar2 == 0) goto LAB_001f7a43;
    break;
  case 3:
    if (uVar2 == 0) goto LAB_001f7a85;
    break;
  case 4:
  case 6:
  case 7:
  case 8:
    break;
  case 5:
    if (uVar2 == 0) goto LAB_001f7ac7;
    break;
  case 9:
    if (uVar2 == 2) goto LAB_001f7b09;
    break;
  case 10:
    if (uVar2 == 0) goto LAB_001f7b53;
    break;
  default:
    if ((tag >> 3 == 999) && (uVar2 == 2)) goto LAB_001f7b9e;
  }
  if (uVar2 == 4) {
    return true;
  }
  if (tag < 8000) {
    bVar1 = internal::WireFormat::SkipField(input,tag,unknown_fields);
  }
  else {
    bVar1 = internal::ExtensionSet::ParseField
                      (&this->_extensions_,tag,input,default_instance_,unknown_fields);
  }
  if (bVar1 == false) {
    return false;
  }
  goto LAB_001f7916;
}

Assistant:

bool FieldOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldOptions_CType_IsValid(value)) {
            set_ctype(static_cast< ::google::protobuf::FieldOptions_CType >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(16)) goto parse_packed;
        break;
      }

      // optional bool packed = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_packed:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &packed_)));
          set_has_packed();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(24)) goto parse_deprecated;
        break;
      }

      // optional bool deprecated = 3 [default = false];
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_deprecated:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
          set_has_deprecated();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(40)) goto parse_lazy;
        break;
      }

      // optional bool lazy = 5 [default = false];
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_lazy:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &lazy_)));
          set_has_lazy();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(74)) goto parse_experimental_map_key;
        break;
      }

      // optional string experimental_map_key = 9;
      case 9: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_experimental_map_key:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_experimental_map_key()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->experimental_map_key().data(), this->experimental_map_key().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(80)) goto parse_weak;
        break;
      }

      // optional bool weak = 10 [default = false];
      case 10: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_weak:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &weak_)));
          set_has_weak();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}